

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O1

string * __thiscall
IDLExport::getIDLRelative
          (string *__return_storage_ptr__,IDLExport *this,Type *type,string *relative_to)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  long lVar3;
  first_finderF<const_char_*,_boost::algorithm::is_equal> Finder;
  iterator_range<const_char_*> FormatResult;
  long *plVar4;
  size_type *psVar5;
  _Alloc_hider _Var6;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var7;
  size_type sVar8;
  size_type sVar9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var10;
  bool bVar11;
  const_formatF<boost::iterator_range<const_char_*>_> Formatter;
  iterator_range<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  FindResult;
  string ns;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  base;
  string local_e0;
  char *local_c0;
  char *pcStack_b8;
  char local_b0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  string local_40;
  
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  anon_unknown.dwarf_196f0::getIDLBase(&local_80,type,this,&local_40);
  if (local_80.first._M_string_length == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_80.second._M_dataplus._M_p,
               local_80.second._M_dataplus._M_p + local_80.second._M_string_length);
  }
  else {
    Typelib::Type::getBasename_abi_cxx11_();
    plVar4 = (long *)std::__cxx11::string::replace
                               ((ulong)&local_c0,0,(char *)0x0,
                                (ulong)local_80.first._M_dataplus._M_p);
    paVar2 = &local_e0.field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0.field_2._8_8_ = plVar4[3];
      local_e0._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar5;
      local_e0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_e0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Typelib::getMinimalPathTo((string *)&local_a0,(string *)&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if (local_c0 != local_b0) {
      operator_delete(local_c0);
    }
    local_e0._M_dataplus._M_p = "/";
    local_e0._M_string_length = 0x11808b;
    pcVar1 = local_a0._M_dataplus._M_p + local_a0._M_string_length;
    _Var6._M_p = local_a0._M_dataplus._M_p;
    _Var7._M_current = pcVar1;
    _Var10._M_current = pcVar1;
    if (local_a0._M_string_length != 0) {
      do {
        local_a0._M_string_length = local_a0._M_string_length - 1;
        sVar8 = 0;
        do {
          sVar9 = sVar8;
          if ((_Var6._M_p[sVar8] != "/"[sVar8]) ||
             (sVar9 = sVar8 + 1, local_a0._M_string_length == sVar8)) break;
          bVar11 = sVar8 != 0;
          sVar8 = sVar9;
        } while (bVar11);
        _Var7._M_current = _Var6._M_p;
        _Var10._M_current = _Var6._M_p + sVar9;
      } while ((sVar9 != 1) &&
              (_Var6._M_p = _Var6._M_p + 1, _Var7._M_current = pcVar1, _Var10._M_current = pcVar1,
              _Var6._M_p != pcVar1));
    }
    if (_Var7._M_current != _Var10._M_current) {
      local_c0 = "::";
      pcStack_b8 = "";
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Finder.m_Search.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "/";
      Finder._16_8_ = local_e0.field_2._M_allocated_capacity;
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      FormatResult.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "::";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_End =
           "";
      Formatter.m_Format.
      super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
      super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.m_Begin
           = "::";
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_End._M_current = _Var10._M_current;
      FindResult.
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_boost::iterators::incrementable_traversal_tag>
      .m_Begin._M_current = _Var7._M_current;
      boost::algorithm::detail::
      find_format_all_impl2<std::__cxx11::string,boost::algorithm::detail::first_finderF<char_const*,boost::algorithm::is_equal>,boost::algorithm::detail::const_formatF<boost::iterator_range<char_const*>>,boost::iterator_range<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,boost::iterator_range<char_const*>>
                (&local_a0,Finder,Formatter,FindResult,FormatResult);
    }
    anon_unknown.dwarf_196f0::normalizeIDLName(&local_e0,&local_a0);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_e0,(ulong)local_80.second._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar4 + 2);
    if ((size_type *)*plVar4 == psVar5) {
      lVar3 = plVar4[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar4[1];
    *plVar4 = (long)psVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second._M_dataplus._M_p != &local_80.second.field_2) {
    operator_delete(local_80.second._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
    operator_delete(local_80.first._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string IDLExport::getIDLRelative(Type const& type, std::string const& relative_to) const
{
    return ::getIDLRelative(type, relative_to, *this);
}